

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void BrotliEncoderDestroyInstance(BrotliEncoderState *state)

{
  MemoryManager *m;
  brotli_free_func UNRECOVERED_JUMPTABLE;
  void *pvVar1;
  
  if (state != (BrotliEncoderState *)0x0) {
    UNRECOVERED_JUMPTABLE = (state->memory_manager_).free_func;
    pvVar1 = (state->memory_manager_).opaque;
    m = &state->memory_manager_;
    BrotliFree(m,state->storage_);
    state->storage_ = (uint8_t *)0x0;
    BrotliFree(m,state->commands_);
    state->commands_ = (Command_conflict *)0x0;
    BrotliFree(m,(state->ringbuffer_).data_);
    (state->ringbuffer_).data_ = (uint8_t *)0x0;
    if (state->hasher_ != (HasherHandle)0x0) {
      BrotliFree(m,state->hasher_);
      state->hasher_ = (HasherHandle)0x0;
    }
    BrotliFree(m,state->large_table_);
    state->large_table_ = (int *)0x0;
    BrotliFree(m,state->command_buf_);
    state->command_buf_ = (uint32_t *)0x0;
    BrotliFree(m,state->literal_buf_);
    state->literal_buf_ = (uint8_t *)0x0;
    (*UNRECOVERED_JUMPTABLE)(pvVar1,state);
    return;
  }
  return;
}

Assistant:

void BrotliEncoderDestroyInstance(BrotliEncoderState* state) {
  if (!state) {
    return;
  } else {
    MemoryManager* m = &state->memory_manager_;
    brotli_free_func free_func = m->free_func;
    void* opaque = m->opaque;
    BrotliEncoderCleanupState(state);
    free_func(opaque, state);
  }
}